

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceImportExternalSemaphoreExt
          (ze_device_handle_t hDevice,ze_external_semaphore_ext_desc_t *desc,
          ze_external_semaphore_ext_handle_t *phSemaphore)

{
  ze_external_semaphore_ext_handle_t p_Var1;
  ze_pfnDeviceImportExternalSemaphoreExt_t pfnImportExternalSemaphoreExt;
  ze_result_t result;
  ze_external_semaphore_ext_handle_t *phSemaphore_local;
  ze_external_semaphore_ext_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  
  pfnImportExternalSemaphoreExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2b0 == (code *)0x0) {
    p_Var1 = (ze_external_semaphore_ext_handle_t)context_t::get((context_t *)&context);
    *phSemaphore = p_Var1;
  }
  else {
    pfnImportExternalSemaphoreExt._4_4_ = (*DAT_0011c2b0)(hDevice,desc,phSemaphore);
  }
  return pfnImportExternalSemaphoreExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceImportExternalSemaphoreExt(
        ze_device_handle_t hDevice,                     ///< [in] The device handle.
        const ze_external_semaphore_ext_desc_t* desc,   ///< [in] The pointer to external semaphore descriptor.
        ze_external_semaphore_ext_handle_t* phSemaphore ///< [out] The handle of the external semaphore imported.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnImportExternalSemaphoreExt = context.zeDdiTable.Device.pfnImportExternalSemaphoreExt;
        if( nullptr != pfnImportExternalSemaphoreExt )
        {
            result = pfnImportExternalSemaphoreExt( hDevice, desc, phSemaphore );
        }
        else
        {
            // generic implementation
            *phSemaphore = reinterpret_cast<ze_external_semaphore_ext_handle_t>( context.get() );

        }

        return result;
    }